

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

void __thiscall
kratos::Enum::Enum(Enum *this,string *name,
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  *values,uint32_t width)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  _Base_ptr p_Var3;
  UserException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_string_view<char> bVar4;
  string_view format_str;
  format_args args;
  undefined1 local_88 [8];
  shared_ptr<kratos::EnumConst> c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  Enum *local_48;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::EnumConst>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::EnumConst>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::EnumConst>>>>
  *local_40;
  uint32_t local_34 [2];
  uint32_t width_local;
  
  (this->super_enable_shared_from_this<kratos::Enum>)._M_weak_this.
  super___weak_ptr<kratos::Enum,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<kratos::Enum>)._M_weak_this.
  super___weak_ptr<kratos::Enum,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_40 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::EnumConst>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::EnumConst>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::EnumConst>>>>
              *)&this->values;
  p_Var1 = &(this->values)._M_t._M_impl.super__Rb_tree_header;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_68._M_string_length = (size_type)&this->name;
  local_48 = this;
  local_34[0] = width;
  std::__cxx11::string::string((string *)local_68._M_string_length,(string *)name);
  this->external = false;
  this->width_ = width;
  this->local_ = true;
  bVar2 = is_valid_variable_name(name);
  if (bVar2) {
    for (p_Var3 = (values->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var3 != &(values->_M_t)._M_impl.super__Rb_tree_header;
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
      local_68.field_2._M_allocated_capacity = (size_type)Const::const_gen();
      local_68._M_dataplus._M_p = (pointer)local_48;
      std::
      make_shared<kratos::EnumConst,kratos::Generator*,unsigned_long_const&,unsigned_int&,kratos::Enum*,std::__cxx11::string_const&>
                ((Generator **)local_88,&local_68.field_2._M_allocated_capacity,&p_Var3[2]._M_color,
                 (Enum **)local_34,&local_68);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::EnumConst>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::EnumConst>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::EnumConst>>>>
      ::_M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<kratos::EnumConst>&>
                (local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (p_Var3 + 1),(shared_ptr<kratos::EnumConst> *)local_88);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&c);
    }
    return;
  }
  this_00 = (UserException *)__cxa_allocate_exception(0x10);
  local_68.field_2._M_allocated_capacity = (size_type)(name->_M_dataplus)._M_p;
  local_68.field_2._8_8_ = name->_M_string_length;
  bVar4 = fmt::v7::to_string_view<char,_0>("{0} is a SystemVerilog keyword");
  format_str.data_ = (char *)bVar4.size_;
  format_str.size_ = 0xd;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_68.field_2;
  fmt::v7::detail::vformat_abi_cxx11_((string *)local_88,(detail *)bVar4.data_,format_str,args);
  UserException::UserException(this_00,(string *)local_88);
  __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Enum::Enum(const std::string &name, const std::map<std::string, uint64_t> &values, uint32_t width)
    : name(name), width_(width) {
    if (!is_valid_variable_name(name)) {
        throw UserException(::format("{0} is a SystemVerilog keyword", name));
    }
    for (auto const &[n, value] : values) {
        auto c = std::make_shared<EnumConst>(Const::const_gen(), value, width, this, n);
        this->values.emplace(n, c);
    }
}